

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall flatbuffers::cpp::CppGenerator::GenMember(CppGenerator *this,FieldDef *field)

{
  bool bVar1;
  SymbolTable<flatbuffers::Value> *pSVar2;
  Value *pVVar3;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator<char> local_131;
  string local_130;
  Value *local_110;
  Value *native_default;
  string field_di;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  string *full_type;
  allocator<char> local_61;
  string local_60;
  Value *local_40;
  Value *cpp_type;
  string type;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  if ((((field->deprecated & 1U) == 0) && ((field->value).type.base_type != BASE_TYPE_UTYPE)) &&
     ((type.field_2._8_8_ = field, bVar1 = IsVector(&(field->value).type), !bVar1 ||
      (*(int *)(type.field_2._8_8_ + 0xcc) != 1)))) {
    GenTypeNative_abi_cxx11_
              ((string *)&cpp_type,this,(Type *)(type.field_2._8_8_ + 200),false,
               (FieldDef *)type.field_2._8_8_,false);
    pSVar2 = (SymbolTable<flatbuffers::Value> *)(type.field_2._8_8_ + 0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"cpp_type",&local_61);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(pSVar2,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    field_di.field_2._M_local_buf[0xf] = '\0';
    field_di.field_2._M_local_buf[0xe] = '\0';
    local_40 = pVVar3;
    if (pVVar3 == (Value *)0x0) {
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpp_type,
                     " ");
    }
    else {
      bVar1 = IsVector((Type *)(type.field_2._8_8_ + 200));
      if (bVar1) {
        GenTypeNativePtr(&local_e0,this,&local_40->constant,(FieldDef *)type.field_2._8_8_,false);
        field_di.field_2._M_local_buf[0xf] = '\x01';
        std::operator+(&local_c0,"std::vector<",&local_e0);
        field_di.field_2._M_local_buf[0xe] = '\x01';
        std::operator+(&local_a0,&local_c0,"> ");
      }
      else {
        GenTypeNativePtr(&local_a0,this,&local_40->constant,(FieldDef *)type.field_2._8_8_,false);
      }
    }
    if ((field_di.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_c0);
    }
    if ((field_di.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    local_80 = &local_a0;
    std::__cxx11::string::string((string *)&native_default);
    if (0 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) {
      std::__cxx11::string::operator=((string *)&native_default,"{}");
      pSVar2 = (SymbolTable<flatbuffers::Value> *)(type.field_2._8_8_ + 0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"native_default",&local_131);
      pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(pSVar2,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      local_110 = pVVar3;
      bVar1 = IsScalar(*(BaseType *)(type.field_2._8_8_ + 200));
      if (bVar1) {
        if (local_110 == (Value *)0x0) {
          GetDefaultScalarValue_abi_cxx11_(&local_178,this,(FieldDef *)type.field_2._8_8_,true);
        }
        else {
          std::__cxx11::string::string((string *)&local_178,(string *)&local_110->constant);
        }
        std::operator+(&local_158," = ",&local_178);
        std::__cxx11::string::operator=((string *)&native_default,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
      }
      else if (((*(int *)(type.field_2._8_8_ + 200) == 0xf) &&
               (bVar1 = IsStruct((Type *)(type.field_2._8_8_ + 200)), bVar1)) &&
              (local_110 != (Value *)0x0)) {
        std::operator+(&local_198," = ",&local_110->constant);
        std::__cxx11::string::operator=((string *)&native_default,(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"FIELD_TYPE",&local_1b9)
    ;
    CodeWriter::SetValue(&this->code_,&local_1b8,local_80);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"FIELD_NAME",&local_1e1)
    ;
    Name_abi_cxx11_(&local_208,this,(FieldDef *)type.field_2._8_8_);
    CodeWriter::SetValue(&this->code_,&local_1e0,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"FIELD_DI",&local_229);
    CodeWriter::SetValue(&this->code_,&local_228,(string *)&native_default);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"  {{FIELD_TYPE}}{{FIELD_NAME}}{{FIELD_DI}};",&local_251);
    CodeWriter::operator+=(&this->code_,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::__cxx11::string::~string((string *)&native_default);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&cpp_type);
  }
  return;
}

Assistant:

void GenMember(const FieldDef &field) {
    if (!field.deprecated &&  // Deprecated fields won't be accessible.
        field.value.type.base_type != BASE_TYPE_UTYPE &&
        (!IsVector(field.value.type) ||
         field.value.type.element != BASE_TYPE_UTYPE)) {
      auto type = GenTypeNative(field.value.type, false, field);
      auto cpp_type = field.attributes.Lookup("cpp_type");
      const std::string &full_type =
          (cpp_type
               ? (IsVector(field.value.type)
                      ? "std::vector<" +
                            GenTypeNativePtr(cpp_type->constant, &field,
                                             false) +
                            "> "
                      : GenTypeNativePtr(cpp_type->constant, &field, false))
               : type + " ");
      // Generate default member initializers for >= C++11.
      std::string field_di;
      if (opts_.g_cpp_std >= cpp::CPP_STD_11) {
        field_di = "{}";
        auto native_default = field.attributes.Lookup("native_default");
        // Scalar types get parsed defaults, raw pointers get nullptrs.
        if (IsScalar(field.value.type.base_type)) {
          field_di =
              " = " + (native_default ? std::string(native_default->constant)
                                      : GetDefaultScalarValue(field, true));
        } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
          if (IsStruct(field.value.type) && native_default) {
            field_di = " = " + native_default->constant;
          }
        }
      }
      code_.SetValue("FIELD_TYPE", full_type);
      code_.SetValue("FIELD_NAME", Name(field));
      code_.SetValue("FIELD_DI", field_di);
      code_ += "  {{FIELD_TYPE}}{{FIELD_NAME}}{{FIELD_DI}};";
    }
  }